

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTSerializer.cpp
# Opt level: O1

void __thiscall
slang::ast::ASTSerializer::visit<slang::ast::NewCovergroupExpression>
          (ASTSerializer *this,NewCovergroupExpression *elem,bool inMembersArray)

{
  char *pcVar1;
  Type *this_00;
  size_t sVar2;
  string_view name;
  string_view value;
  string_view name_00;
  ConstantValue constant;
  EvalContext ctx;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  _Stack_268;
  EvalContext local_240;
  
  JsonWriter::startObject(this->writer);
  pcVar1 = *(char **)(toString(slang::ast::ExpressionKind)::strings +
                     (long)(int)(elem->super_Expression).kind * 8);
  sVar2 = strlen(pcVar1);
  name._M_str = "kind";
  name._M_len = 4;
  JsonWriter::writeProperty(this->writer,name);
  value._M_str = pcVar1;
  value._M_len = sVar2;
  JsonWriter::writeValue(this->writer,value);
  this_00 = (elem->super_Expression).type.ptr;
  if (this_00 != (Type *)0x0) {
    name_00._M_str = "type";
    name_00._M_len = 4;
    JsonWriter::writeProperty(this->writer,name_00);
    local_240.compilation = (Compilation *)((ulong)local_240.compilation & 0xffffffffffffff00);
    Symbol::visit<slang::ast::ASTSerializer&,bool&>(&this_00->super_Symbol,this,(bool *)&local_240);
    NewCovergroupExpression::serializeTo(elem,this);
    local_240.compilation = this->compilation;
    local_240.flags.m_bits = '\x02';
    local_240.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>.data_ =
         (pointer)local_240.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>.firstElement
    ;
    local_240._12_8_ = 0;
    local_240._20_8_ = 0;
    local_240.queueTarget._4_4_ = 0;
    local_240.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>.len = 0;
    local_240.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>.cap = 2;
    pcVar1 = local_240.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.firstElement;
    local_240.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.len = 0;
    local_240.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.cap = 5;
    local_240.diags.super_SmallVector<slang::Diagnostic,_2UL>.
    super_SmallVectorBase<slang::Diagnostic>.data_ =
         (pointer)local_240.diags.super_SmallVector<slang::Diagnostic,_2UL>.
                  super_SmallVectorBase<slang::Diagnostic>.firstElement;
    local_240.diags.super_SmallVector<slang::Diagnostic,_2UL>.
    super_SmallVectorBase<slang::Diagnostic>.len = 0;
    local_240.diags.super_SmallVector<slang::Diagnostic,_2UL>.
    super_SmallVectorBase<slang::Diagnostic>.cap = 2;
    local_240.disableRange.startLoc = (SourceLocation)0x0;
    local_240.disableRange.endLoc = (SourceLocation)0x0;
    local_240.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.data_ = (pointer)pcVar1;
    Expression::eval((ConstantValue *)&_Stack_268,&elem->super_Expression,&local_240);
    if (_Stack_268._M_index != '\0') {
      elem = (NewCovergroupExpression *)0x8;
      write(this,8,"constant",(size_t)&_Stack_268);
    }
    JsonWriter::endObject(this->writer);
    std::__detail::__variant::
    _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
    ::~_Variant_storage(&_Stack_268);
    SmallVectorBase<slang::Diagnostic>::cleanup
              ((SmallVectorBase<slang::Diagnostic> *)&local_240.diags,(EVP_PKEY_CTX *)elem);
    if (local_240.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.data_ != (pointer)pcVar1) {
      free(local_240.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.data_);
    }
    SmallVectorBase<slang::ast::EvalContext::Frame>::cleanup
              (&local_240.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>,
               (EVP_PKEY_CTX *)elem);
    return;
  }
  assert::assertFailed
            ("ptr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
             ,0x26,
             "T slang::not_null<const slang::ast::Type *>::get() const [T = const slang::ast::Type *]"
            );
}

Assistant:

void ASTSerializer::visit(const T& elem, bool inMembersArray) {
    // TODO: remove once we no longer support gcc-10
    (void)inMembersArray;

    if constexpr (std::is_base_of_v<Expression, T>) {
        writer.startObject();
        write("kind", toString(elem.kind));
        write("type", *elem.type);

        if constexpr (!std::is_same_v<Expression, T>) {
            elem.serializeTo(*this);
        }

        EvalContext ctx(compilation, EvalFlags::CacheResults);
        ConstantValue constant = elem.eval(ctx);
        if (constant)
            write("constant", constant);

        writer.endObject();
    }
    else if constexpr (std::is_base_of_v<Statement, T>) {
        writer.startObject();
        write("kind", toString(elem.kind));

        if constexpr (!std::is_same_v<Statement, T>) {
            elem.serializeTo(*this);
        }

        writer.endObject();
    }
    else if constexpr (std::is_base_of_v<TimingControl, T> || std::is_base_of_v<Constraint, T> ||
                       std::is_base_of_v<AssertionExpr, T> ||
                       std::is_base_of_v<BinsSelectExpr, T> || std::is_base_of_v<Pattern, T>) {
        writer.startObject();
        write("kind", toString(elem.kind));
        if constexpr (!std::is_same_v<TimingControl, T> && !std::is_same_v<Constraint, T> &&
                      !std::is_same_v<AssertionExpr, T> && !std::is_same_v<BinsSelectExpr, T> &&
                      !std::is_same_v<Pattern, T>) {
            elem.serializeTo(*this);
        }
        writer.endObject();
    }
    else if constexpr (std::is_base_of_v<Type, T> && !std::is_same_v<TypeAliasType, T> &&
                       !std::is_same_v<ClassType, T> && !std::is_same_v<CovergroupType, T>) {
        writer.writeValue(elem.toString());
    }
    else {
        if constexpr (std::is_base_of_v<Type, T>) {
            if (!inMembersArray) {
                writer.writeValue(elem.toString());
                return;
            }
        }

        // Ignore built-in methods on class types.
        if constexpr (std::is_same_v<SubroutineSymbol, T>) {
            if (elem.flags.has(MethodFlags::NotConst | MethodFlags::Randomize))
                return;
        }

        writer.startObject();
        write("name", elem.name);
        write("kind", toString(elem.kind));

        if (includeAddrs)
            write("addr", uintptr_t(&elem));

        auto scope = elem.getParentScope();
        if (scope) {
            auto attributes = scope->getCompilation().getAttributes(elem);
            if (!attributes.empty()) {
                startArray("attributes");
                for (auto attr : attributes)
                    serialize(*attr);
                endArray();
            }
        }

        if constexpr (std::is_base_of_v<ValueSymbol, T>) {
            write("type", elem.getType());

            if (auto init = elem.getInitializer())
                write("initializer", *init);
        }

        if constexpr (std::is_base_of_v<Scope, T>) {
            if (!elem.empty()) {
                startArray("members");
                for (auto& member : elem.members())
                    serialize(member, /* inMembersArray */ true);
                endArray();
            }
        }

        if constexpr (!std::is_same_v<Symbol, T>) {
            elem.serializeTo(*this);
        }

        writer.endObject();
    }
}